

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrape.c
# Opt level: O0

course_results * scrape_html(char *html)

{
  int *piVar1;
  course *course;
  course_strings course_data;
  size_t sStack_30;
  int ret;
  size_t i;
  size_t capacity;
  course_results *results;
  char *html_local;
  
  results = (course_results *)html;
  capacity = (size_t)init_course_results(&i);
  if ((course_results *)capacity == (course_results *)0x0) {
    html_local = (char *)0x0;
  }
  else {
    sStack_30 = 0;
    while (*(char *)((long)&results->courses + sStack_30) != '\0') {
      if (i <= *(long *)(capacity + 8) + 1U) {
        resize_course_results((course_results *)capacity,&i);
      }
      course_data.call_number._4_4_ =
           read_course_data((course_strings *)&course,(char *)results,&stack0xffffffffffffffd0);
      if (course_data.call_number._4_4_ != 0) {
        destroy_course_results((course_results *)capacity);
        piVar1 = __errno_location();
        *piVar1 = -0x69;
        return (course_results *)0x0;
      }
      course_data.call_number._4_4_ =
           create_course((course *)(*(long *)capacity + *(long *)(capacity + 8) * 0x68),
                         (course_strings *)&course);
      if (course_data.call_number._4_4_ != 0) {
        destroy_course_results((course_results *)capacity);
        piVar1 = __errno_location();
        *piVar1 = -0x69;
        return (course_results *)0x0;
      }
      course_data.call_number._4_4_ = 0;
    }
    *(undefined8 *)capacity = 0;
    *(undefined8 *)(capacity + 8) = 0;
    html_local = (char *)capacity;
  }
  return (course_results *)html_local;
}

Assistant:

struct course_results *scrape_html(const char *html)
{
	struct course_results *results;
	size_t capacity;
	size_t i;
	int ret;

	results = init_course_results(&capacity);
	if (!results) {
		return NULL;
	}

	i = 0;
	while (html[i]) {
		struct course_strings course_data;
		struct course *course;

		if (results->length + 1 >= capacity) {
			resize_course_results(results, &capacity);
		}

		ret = read_course_data(&course_data, html, &i);
		if (ret) {
			destroy_course_results(results);
			errno = UCRCOURSE_ERR_RESPONSE;
			return NULL;
		}

		course = (struct course *)(&results->courses[results->length]);
		ret = create_course(course, &course_data);
		if (ret) {
			destroy_course_results(results);
			errno = UCRCOURSE_ERR_RESPONSE;
			return NULL;
		}
	}

	/* TEMP */
	results->courses = NULL;
	results->length = 0;

	return results;
}